

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membuf.c
# Opt level: O0

int d2s_buffered_n(double f,char *result)

{
  _Bool _Var1;
  uint64_t uVar2;
  ulong ieeeMantissa_00;
  uint64_t uVar3;
  floating_decimal_64 fVar4;
  uint32_t r;
  uint64_t q;
  undefined1 auStack_50 [7];
  _Bool isSmallInt;
  floating_decimal_64 v;
  uint32_t ieeeExponent;
  uint64_t ieeeMantissa;
  _Bool ieeeSign;
  uint64_t bits;
  char *result_local;
  double f_local;
  
  uVar2 = double_to_bits(f);
  ieeeMantissa_00 = uVar2 & 0xfffffffffffff;
  v._12_4_ = (uint)(uVar2 >> 0x34) & 0x7ff;
  if ((v._12_4_ == 0x7ff) || ((v._12_4_ == 0 && (ieeeMantissa_00 == 0)))) {
    f_local._4_4_ = copy_special_str(result,(long)uVar2 < 0,v._12_4_ != 0,ieeeMantissa_00 != 0);
  }
  else {
    _Var1 = d2d_small_int(ieeeMantissa_00,v._12_4_,(floating_decimal_64 *)auStack_50);
    if (_Var1) {
      while (uVar3 = div10(_auStack_50), (int)_auStack_50 + (int)uVar3 * -10 == 0) {
        v.mantissa._0_4_ = (int)v.mantissa + 1;
        _auStack_50 = uVar3;
      }
    }
    else {
      fVar4 = d2d(ieeeMantissa_00,v._12_4_);
      _auStack_50 = fVar4.mantissa;
      v.mantissa._0_4_ = fVar4.exponent;
    }
    fVar4.exponent = (int)v.mantissa;
    fVar4.mantissa = _auStack_50;
    fVar4._12_4_ = 0;
    f_local._4_4_ = to_chars(fVar4,(long)uVar2 < 0,result);
  }
  return f_local._4_4_;
}

Assistant:

static int d2s_buffered_n(double f, char* result) {
	// Step 1: Decode the floating-point number, and unify normalized and subnormal cases.
	const uint64_t bits = double_to_bits(f);

#ifdef RYU_DEBUG
	printf("IN=");
  for (int32_t bit = 63; bit >= 0; --bit) {
    printf("%d", (int) ((bits >> bit) & 1));
  }
  printf("\n");
#endif

	// Decode bits into sign, mantissa, and exponent.
	const bool ieeeSign = ((bits >> (DOUBLE_MANTISSA_BITS + DOUBLE_EXPONENT_BITS)) & 1) != 0;
	const uint64_t ieeeMantissa = bits & ((1ull << DOUBLE_MANTISSA_BITS) - 1);
	const uint32_t ieeeExponent = (uint32_t) ((bits >> DOUBLE_MANTISSA_BITS) & ((1u << DOUBLE_EXPONENT_BITS) - 1));
	// Case distinction; exit early for the easy cases.
	if (ieeeExponent == ((1u << DOUBLE_EXPONENT_BITS) - 1u) || (ieeeExponent == 0 && ieeeMantissa == 0)) {
		return copy_special_str(result, ieeeSign, ieeeExponent, ieeeMantissa);
	}

	floating_decimal_64 v;
	const bool isSmallInt = d2d_small_int(ieeeMantissa, ieeeExponent, &v);
	if (isSmallInt) {
		// For small integers in the range [1, 2^53), v.mantissa might contain trailing (decimal) zeros.
		// For scientific notation we need to move these zeros into the exponent.
		// (This is not needed for fixed-point notation, so it might be beneficial to trim
		// trailing zeros in to_chars only if needed - once fixed-point notation output is implemented.)
		for (;;) {
			const uint64_t q = div10(v.mantissa);
			const uint32_t r = ((uint32_t) v.mantissa) - 10 * ((uint32_t) q);
			if (r != 0) {
				break;
			}
			v.mantissa = q;
			++v.exponent;
		}
	} else {
		v = d2d(ieeeMantissa, ieeeExponent);
	}

	return to_chars(v, ieeeSign, result);
}